

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnWriter::HandleDefineLevels
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,
          ValidityMask *validity,idx_t count,uint16_t define_value,uint16_t null_value)

{
  unsigned_long *puVar1;
  uint16_t uVar2;
  IOException *pIVar3;
  pointer puVar4;
  unsigned_short *puVar5;
  iterator iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  reference rVar10;
  unsigned_short local_62;
  vector<unsigned_short,std::allocator<unsigned_short>> *local_60;
  ColumnWriter *local_58;
  string local_50;
  
  local_58 = this;
  local_62 = define_value;
  if (parent == (ColumnWriterState *)0x0) {
    if ((validity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
       ) {
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_fill_insert
                (&(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (iterator)
                 (state->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish,count,&local_62);
    }
    else if (count != 0) {
      local_60 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state->definition_levels;
      uVar8 = 0;
      do {
        puVar1 = (validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          bVar9 = true;
        }
        else {
          bVar9 = (puVar1[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0;
        }
        puVar5 = &null_value;
        if (bVar9 != false) {
          puVar5 = &local_62;
        }
        iVar6._M_current =
             (state->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
            .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
          _M_realloc_insert<unsigned_short_const&>(local_60,iVar6,puVar5);
        }
        else {
          *iVar6._M_current = *puVar5;
          (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        state->null_count = state->null_count + (ulong)(bVar9 ^ 1);
        uVar8 = uVar8 + 1;
      } while (count != uVar8);
    }
    if ((local_58->can_have_nulls == false) && (state->null_count != 0)) {
      pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "Parquet writer: map key column is not allowed to contain NULL values","");
      IOException::IOException(pIVar3,&local_50);
      __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar6._M_current =
         (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar8 = (long)iVar6._M_current -
            (long)(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    puVar4 = (parent->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar8 < (ulong)((long)(parent->definition_levels).
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) {
      local_60 = (vector<unsigned_short,std::allocator<unsigned_short>> *)&state->definition_levels;
      uVar7 = 0;
      do {
        if (*(unsigned_short *)((long)puVar4 + uVar8) == 0xffff) {
          puVar1 = (validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar1 == (unsigned_long *)0x0) || ((puVar1[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))
          {
            uVar2 = local_62;
            if (iVar6._M_current ==
                (state->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              puVar5 = &local_62;
              goto LAB_010e52cc;
            }
          }
          else {
            if (local_58->can_have_nulls == false) {
              pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,
                         "Parquet writer: map key column is not allowed to contain NULL values","");
              IOException::IOException(pIVar3,&local_50);
              __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
            }
            state->null_count = state->null_count + 1;
            uVar2 = null_value;
            if (iVar6._M_current ==
                (state->definition_levels).
                super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              puVar5 = &null_value;
LAB_010e52cc:
              ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>(local_60,iVar6,puVar5);
              goto LAB_010e52d1;
            }
          }
          *iVar6._M_current = uVar2;
          (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        else {
          if (iVar6._M_current ==
              (state->definition_levels).
              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      (local_60,iVar6,(unsigned_short *)((long)puVar4 + uVar8));
          }
          else {
            *iVar6._M_current = *(unsigned_short *)((long)puVar4 + uVar8);
            (state->definition_levels).super_vector<unsigned_short,_std::allocator<unsigned_short>_>
            .super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          state->parent_null_count = state->parent_null_count + 1;
        }
LAB_010e52d1:
        if ((((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
              super__Bit_iterator_base._M_p ==
              (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_p) &&
            (*(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) == 0)
            ) || (rVar10 = vector<bool,_true>::get<true>(&parent->is_empty,(long)uVar8 >> 1),
                 (*rVar10._M_p & rVar10._M_mask) == 0)) {
          uVar7 = uVar7 + 1;
        }
        iVar6._M_current =
             (state->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar8 = (long)iVar6._M_current -
                (long)(state->definition_levels).
                      super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
        puVar4 = (parent->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)(parent->definition_levels).
                                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4));
    }
  }
  return;
}

Assistant:

void ColumnWriter::HandleDefineLevels(ColumnWriterState &state, ColumnWriterState *parent, const ValidityMask &validity,
                                      const idx_t count, const uint16_t define_value, const uint16_t null_value) const {
	if (parent) {
		// parent node: inherit definition level from the parent
		idx_t vector_index = 0;
		while (state.definition_levels.size() < parent->definition_levels.size()) {
			idx_t current_index = state.definition_levels.size();
			if (parent->definition_levels[current_index] != PARQUET_DEFINE_VALID) {
				state.definition_levels.push_back(parent->definition_levels[current_index]);
				state.parent_null_count++;
			} else if (validity.RowIsValid(vector_index)) {
				state.definition_levels.push_back(define_value);
			} else {
				if (!can_have_nulls) {
					throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
				}
				state.null_count++;
				state.definition_levels.push_back(null_value);
			}
			if (parent->is_empty.empty() || !parent->is_empty[current_index]) {
				vector_index++;
			}
		}
	} else {
		// no parent: set definition levels only from this validity mask
		if (validity.AllValid()) {
			state.definition_levels.insert(state.definition_levels.end(), count, define_value);
		} else {
			for (idx_t i = 0; i < count; i++) {
				const auto is_null = !validity.RowIsValid(i);
				state.definition_levels.emplace_back(is_null ? null_value : define_value);
				state.null_count += is_null;
			}
		}
		if (!can_have_nulls && state.null_count != 0) {
			throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
		}
	}
}